

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O1

TaskExecutionResult __thiscall
duckdb::PhysicalOrderMergeTask::ExecuteTask(PhysicalOrderMergeTask *this,TaskExecutionMode mode)

{
  OrderGlobalSinkState *pOVar1;
  BufferManager *buffer_manager;
  Event *this_00;
  MergeSorter merge_sorter;
  undefined1 auStack_58 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_40;
  __uniq_ptr_impl<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>_> local_38;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_30;
  _Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_> local_28;
  
  pOVar1 = this->state;
  buffer_manager = BufferManager::GetBufferManager(this->context);
  MergeSorter::MergeSorter((MergeSorter *)auStack_58,&pOVar1->global_sort_state,buffer_manager);
  MergeSorter::PerformInMergeRound((MergeSorter *)auStack_58);
  this_00 = shared_ptr<duckdb::Event,_true>::operator->(&(this->super_ExecutorTask).event);
  Event::FinishTask(this_00);
  if (local_28.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl !=
      (SortedBlock *)0x0) {
    ::std::default_delete<duckdb::SortedBlock>::operator()
              ((default_delete<duckdb::SortedBlock> *)&local_28,
               (SortedBlock *)
               local_28.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
  }
  local_28.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::SortedBlock_*,_false>)(SortedBlock *)0x0;
  if (local_30._M_head_impl != (SortedBlock *)0x0) {
    ::std::default_delete<duckdb::SortedBlock>::operator()
              ((default_delete<duckdb::SortedBlock> *)&local_30,local_30._M_head_impl);
  }
  local_30._M_head_impl = (SortedBlock *)0x0;
  if ((__uniq_ptr_impl<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>.
      super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>_>)0x0) {
    ::std::default_delete<duckdb::SBScanState>::operator()
              ((default_delete<duckdb::SBScanState> *)&local_38,
               (SBScanState *)
               local_38._M_t.
               super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>
               .super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl);
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>.
  super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl =
       (tuple<duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)0x0;
  if ((tuple<duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)local_40._M_head_impl
      != (_Head_base<0UL,_duckdb::SBScanState_*,_false>)0x0) {
    ::std::default_delete<duckdb::SBScanState>::operator()
              ((default_delete<duckdb::SBScanState> *)&local_40,local_40._M_head_impl);
  }
  return TASK_FINISHED;
}

Assistant:

TaskExecutionResult ExecuteTask(TaskExecutionMode mode) override {
		// Initialize merge sorted and iterate until done
		auto &global_sort_state = state.global_sort_state;
		MergeSorter merge_sorter(global_sort_state, BufferManager::GetBufferManager(context));
		merge_sorter.PerformInMergeRound();
		event->FinishTask();
		return TaskExecutionResult::TASK_FINISHED;
	}